

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O3

void __thiscall QMenu::mouseReleaseEvent(QMenu *this,QMouseEvent *e)

{
  QMenuPrivate *this_00;
  bool bVar1;
  char cVar2;
  QAction *action;
  long lVar3;
  QPoint p;
  long in_FS_OFFSET;
  double dVar4;
  undefined1 auVar5 [16];
  QPoint local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMenuPrivate **)&(this->super_QWidget).field_0x8;
  if ((this_00->field_0x421 & 1) == 0) {
    bVar1 = QMenuPrivate::mouseEventTaken(this_00,e);
    if ((!bVar1) &&
       (bVar1 = QMenuPrivate::mouseDown == this, QMenuPrivate::mouseDown = (QMenu *)0x0, bVar1)) {
      QMenuPrivate::setSyncAction(this_00);
      auVar5 = QEventPoint::globalPosition();
      dVar4 = (double)((ulong)auVar5._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar5._0_8_
      ;
      bVar1 = 2147483647.0 < dVar4;
      if (dVar4 <= -2147483648.0) {
        dVar4 = -2147483648.0;
      }
      local_28.xp.m_i =
           (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar4);
      dVar4 = (double)((ulong)auVar5._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar5._8_8_
      ;
      bVar1 = 2147483647.0 < dVar4;
      if (dVar4 <= -2147483648.0) {
        dVar4 = -2147483648.0;
      }
      local_28.yp.m_i =
           (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar4);
      bVar1 = QMenuPrivate::hasMouseMoved(this_00,&local_28);
      if (bVar1) {
        auVar5 = QEventPoint::position();
        dVar4 = (double)((ulong)auVar5._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                auVar5._0_8_;
        bVar1 = 2147483647.0 < dVar4;
        if (dVar4 <= -2147483648.0) {
          dVar4 = -2147483648.0;
        }
        p.xp.m_i = (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar4)
        ;
        dVar4 = (double)((ulong)auVar5._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
                auVar5._8_8_;
        bVar1 = 2147483647.0 < dVar4;
        if (dVar4 <= -2147483648.0) {
          dVar4 = -2147483648.0;
        }
        p.yp.m_i = (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar4)
        ;
        action = QMenuPrivate::actionAt(this_00,p);
        if (action != (QAction *)0x0) {
          if (action == this_00->currentAction) {
            QAction::menuObject();
            lVar3 = QMetaObject::cast((QObject *)&staticMetaObject);
            if (lVar3 == 0) {
              if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
                QMenuPrivate::activateAction(this_00,action,Trigger,true);
                return;
              }
              goto LAB_0045cfa9;
            }
          }
          else {
            cVar2 = QAction::isEnabled();
            if (cVar2 != '\0') goto LAB_0045cf3d;
          }
          goto LAB_0045cdb8;
        }
      }
LAB_0045cf3d:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        QMenuPrivate::hideUpToMenuBar(this_00);
        return;
      }
      goto LAB_0045cfa9;
    }
  }
LAB_0045cdb8:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
LAB_0045cfa9:
  __stack_chk_fail();
}

Assistant:

void QMenu::mouseReleaseEvent(QMouseEvent *e)
{
    Q_D(QMenu);
    if (d->aboutToHide || d->mouseEventTaken(e))
        return;
    if (QMenuPrivate::mouseDown != this) {
        QMenuPrivate::mouseDown = nullptr;
        return;
    }

    QMenuPrivate::mouseDown = nullptr;
    d->setSyncAction();

    if (!d->hasMouseMoved(e->globalPosition().toPoint())) {
        // We don't want to trigger a menu item if the mouse hasn't moved
        // since the popup was opened. Instead we want to close the menu.
        d->hideUpToMenuBar();
        return;
    }

    QAction *action = d->actionAt(e->position().toPoint());
    if (action && action == d->currentAction) {
        if (!action->menu()) {
#if defined(Q_OS_WIN)
            //On Windows only context menus can be activated with the right button
            if (e->button() == Qt::LeftButton || d->topCausedWidget() == 0)
#endif
                d->activateAction(action, QAction::Trigger);
        }
    } else if (!action || action->isEnabled()) {
        d->hideUpToMenuBar();
    }
}